

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Molecule * __thiscall
OpenMD::MoleculeCreator::createMolecule
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp,int globalIndex,
          LocalIndexManager *localIndexMan)

{
  bool bVar1;
  Molecule *pMVar2;
  iterator sd;
  reference ppAVar3;
  size_t sVar4;
  ConstraintStamp *this_00;
  Molecule *elem1;
  ConstraintPair *elem2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  RealType len;
  Molecule *in_stack_00000100;
  ConstraintPair *cPair;
  ConstraintElem *consElemB;
  ConstraintElem *consElemA;
  RealType distance;
  bool printConstraintForce;
  Atom *atomB;
  Atom *atomA;
  ConstraintStamp *cStamp;
  size_t i_7;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  iterator fai;
  iterator ai;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> freeAtoms;
  size_t i_6;
  size_t nCutoffGroups;
  CutoffGroupStamp *currentCutoffGroupStamp;
  CutoffGroup *cutoffGroup;
  size_t i_5;
  size_t nInversions;
  InversionStamp *currentInversionStamp;
  Inversion *inversion;
  size_t i_4;
  size_t nTorsions;
  TorsionStamp *currentTorsionStamp;
  Torsion *torsion;
  size_t i_3;
  size_t nBends;
  BendStamp *currentBendStamp;
  Bend *bend;
  size_t i_2;
  size_t nBonds;
  BondStamp *currentBondStamp;
  Bond *bond;
  size_t i_1;
  size_t nRigidbodies;
  RigidBodyStamp *currentRigidBodyStamp;
  RigidBody *rb;
  size_t i;
  size_t nAtom;
  AtomStamp *currentAtomStamp;
  Atom *atom;
  Molecule *mol;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_fffffffffffffd08;
  MoleculeStamp *in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_fffffffffffffd20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_fffffffffffffd28;
  ConstraintPair *cp;
  const_iterator in_stack_fffffffffffffd30;
  const_iterator in_stack_fffffffffffffd38;
  MoleculeStamp *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  int globalIndex_00;
  ulong uVar5;
  Molecule *in_stack_fffffffffffffd90;
  bool local_1c1;
  ulong local_1a8;
  iterator in_stack_fffffffffffffe70;
  CutoffGroup *local_158;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_150;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_148;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_140 [4];
  ulong local_120;
  ulong local_118;
  CutoffGroupStamp *local_110;
  undefined8 local_108;
  ulong local_100;
  ulong local_f8;
  InversionStamp *local_f0;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  TorsionStamp *local_d0;
  undefined8 local_c8;
  ulong local_c0;
  ulong local_b8;
  BendStamp *local_b0;
  undefined8 local_a8;
  ulong local_a0;
  ulong local_98;
  BondStamp *local_90;
  undefined8 local_88;
  ulong local_80;
  ulong local_78;
  RigidBodyStamp *local_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  AtomStamp *local_50;
  Atom *local_48;
  Molecule *local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  globalIndex_00 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pMVar2 = (Molecule *)operator_new(400);
  Molecule::Molecule(in_stack_fffffffffffffd90,globalIndex_00,in_stack_fffffffffffffd80);
  local_30 = pMVar2;
  local_58 = MoleculeStamp::getNAtoms((MoleculeStamp *)0x1e1b49);
  for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
    local_50 = MoleculeStamp::getAtomStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_48 = (Atom *)(**(code **)(*in_RDI + 0x10))(in_RDI,local_10,local_50,local_28);
    Molecule::addAtom((Molecule *)in_stack_fffffffffffffd30._M_current,
                      (Atom *)in_stack_fffffffffffffd28._M_current);
  }
  local_78 = MoleculeStamp::getNRigidBodies((MoleculeStamp *)0x1e1c26);
  for (local_80 = 0; local_80 < local_78; local_80 = local_80 + 1) {
    local_70 = MoleculeStamp::getRigidBodyStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_68 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_30,local_70,local_28);
    Molecule::addRigidBody
              ((Molecule *)in_stack_fffffffffffffd30._M_current,
               (RigidBody *)in_stack_fffffffffffffd28._M_current);
  }
  local_98 = MoleculeStamp::getNBonds((MoleculeStamp *)0x1e1ce0);
  for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
    local_90 = MoleculeStamp::getBondStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_88 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_10,local_30,local_90,local_28);
    Molecule::addBond((Molecule *)in_stack_fffffffffffffd30._M_current,
                      (Bond *)in_stack_fffffffffffffd28._M_current);
  }
  local_b8 = MoleculeStamp::getNBends((MoleculeStamp *)0x1e1d9a);
  for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
    local_b0 = MoleculeStamp::getBendStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_a8 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_10,local_30,local_b0,local_28);
    Molecule::addBend((Molecule *)in_stack_fffffffffffffd30._M_current,
                      (Bend *)in_stack_fffffffffffffd28._M_current);
  }
  local_d8 = MoleculeStamp::getNTorsions((MoleculeStamp *)0x1e1e54);
  for (local_e0 = 0; local_e0 < local_d8; local_e0 = local_e0 + 1) {
    local_d0 = MoleculeStamp::getTorsionStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_c8 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,local_30,local_d0,local_28);
    Molecule::addTorsion
              ((Molecule *)in_stack_fffffffffffffd30._M_current,
               (Torsion *)in_stack_fffffffffffffd28._M_current);
  }
  local_f8 = MoleculeStamp::getNInversions((MoleculeStamp *)0x1e1f0e);
  for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
    local_f0 = MoleculeStamp::getInversionStamp
                         (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20))
    ;
    local_e8 = (**(code **)(*in_RDI + 0x38))(in_RDI,local_10,local_30,local_f0,local_28);
    if (local_e8 != 0) {
      Molecule::addInversion
                ((Molecule *)in_stack_fffffffffffffd30._M_current,
                 (Inversion *)in_stack_fffffffffffffd28._M_current);
    }
  }
  local_118 = MoleculeStamp::getNCutoffGroups((MoleculeStamp *)0x1e1fd5);
  for (local_120 = 0; local_120 < local_118; local_120 = local_120 + 1) {
    local_110 = MoleculeStamp::getCutoffGroupStamp
                          (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20)
                          );
    local_108 = (**(code **)(*in_RDI + 0x40))(in_RDI,local_30,local_110,local_28);
    Molecule::addCutoffGroup
              ((Molecule *)in_stack_fffffffffffffd30._M_current,
               (CutoffGroup *)in_stack_fffffffffffffd28._M_current);
  }
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x1e2083);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(local_140);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_148);
  local_48 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffd30._M_current,
                                 (iterator *)in_stack_fffffffffffffd28._M_current);
  while (local_48 != (Atom *)0x0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
               in_stack_fffffffffffffd20._M_current,
               (value_type *)
               CONCAT17(in_stack_fffffffffffffd1f,
                        CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)));
    local_48 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffd30._M_current,
                                  (iterator *)in_stack_fffffffffffffd28._M_current);
  }
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_150);
  local_158 = Molecule::beginCutoffGroup
                        ((Molecule *)in_stack_fffffffffffffd30._M_current,
                         (iterator *)in_stack_fffffffffffffd28._M_current);
  while (local_158 != (CutoffGroup *)0x0) {
    local_48 = CutoffGroup::beginAtom
                         ((CutoffGroup *)in_stack_fffffffffffffd30._M_current,
                          (iterator *)in_stack_fffffffffffffd28._M_current);
    while (local_48 != (Atom *)0x0) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin(in_stack_fffffffffffffd08)
      ;
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_stack_fffffffffffffd08);
      std::
      remove<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,OpenMD::Atom*>
                (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                 (Atom **)CONCAT17(in_stack_fffffffffffffd1f,
                                   CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)));
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom*const*,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>
      ::__normal_iterator<OpenMD::Atom**>
                ((__normal_iterator<OpenMD::Atom_*const_*,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  *)in_stack_fffffffffffffd10,
                 (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  *)in_stack_fffffffffffffd08);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_stack_fffffffffffffd08);
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom*const*,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>
      ::__normal_iterator<OpenMD::Atom**>
                ((__normal_iterator<OpenMD::Atom_*const_*,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  *)in_stack_fffffffffffffd10,
                 (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  *)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffe70 =
           std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::erase
                     (in_stack_fffffffffffffd28._M_current,in_stack_fffffffffffffd38,
                      in_stack_fffffffffffffd30);
      local_48 = CutoffGroup::nextAtom
                           ((CutoffGroup *)in_stack_fffffffffffffd30._M_current,
                            (iterator *)in_stack_fffffffffffffd28._M_current);
    }
    local_158 = Molecule::nextCutoffGroup
                          ((Molecule *)in_stack_fffffffffffffd30._M_current,
                           (iterator *)in_stack_fffffffffffffd28._M_current);
  }
  sd = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                 (in_stack_fffffffffffffd08);
  local_148._M_current = sd._M_current;
  while( true ) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_stack_fffffffffffffd08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                        *)in_stack_fffffffffffffd08);
    pMVar2 = local_30;
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
              ::operator*(&local_148);
    local_108 = (**(code **)(*in_RDI + 0x48))(in_RDI,pMVar2,*ppAVar3,local_28);
    Molecule::addCutoffGroup
              ((Molecule *)in_stack_fffffffffffffd30._M_current,
               (CutoffGroup *)in_stack_fffffffffffffd28._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::operator++(&local_148);
  }
  (**(code **)(*in_RDI + 0x50))(in_RDI,local_30);
  local_1a8 = 0;
  while (uVar5 = local_1a8, sVar4 = MoleculeStamp::getNConstraints((MoleculeStamp *)0x1e2446),
        uVar5 < sVar4) {
    this_00 = MoleculeStamp::getConstraintStamp
                        (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    ConstraintStamp::getA(this_00);
    Molecule::getAtomAt((Molecule *)in_stack_fffffffffffffd10,
                        (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    ConstraintStamp::getB(this_00);
    Molecule::getAtomAt((Molecule *)in_stack_fffffffffffffd10,
                        (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    local_1c1 = false;
    bVar1 = ConstraintStamp::havePrintConstraintForce((ConstraintStamp *)0x1e252a);
    if (bVar1) {
      local_1c1 = ConstraintStamp::getPrintConstraintForce((ConstraintStamp *)0x1e2547);
    }
    bVar1 = ConstraintStamp::haveConstrainedDistance((ConstraintStamp *)0x1e2567);
    if (bVar1) {
      len = ConstraintStamp::getConstrainedDistance((ConstraintStamp *)0x1e25be);
      elem1 = (Molecule *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                ((ConstraintElem *)in_stack_fffffffffffffe70._M_current,(StuntDouble *)sd._M_current
                );
      pMVar2 = elem1;
      elem2 = (ConstraintPair *)operator_new(0x28);
      ConstraintElem::ConstraintElem
                ((ConstraintElem *)in_stack_fffffffffffffe70._M_current,(StuntDouble *)sd._M_current
                );
      cp = elem2;
      in_stack_fffffffffffffd20._M_current = (Atom **)operator_new(0x28);
      ConstraintPair::ConstraintPair
                ((ConstraintPair *)in_stack_fffffffffffffd20._M_current,(ConstraintElem *)elem1,
                 (ConstraintElem *)elem2,len,local_1c1);
      Molecule::addConstraintPair(pMVar2,cp);
    }
    else {
      snprintf(painCave.errMsg,2000,
               "Constraint Error: A non-bond constraint was specified\n\twithout providing a value for the constrainedDistance.\n"
              );
      painCave.isFatal = 1;
      simError();
    }
    local_1a8 = local_1a8 + 1;
  }
  (**(code **)(*in_RDI + 0x58))(in_RDI,local_30);
  bVar1 = MoleculeStamp::haveConstrainTotalCharge((MoleculeStamp *)0x1e275b);
  if (bVar1) {
    pMVar2 = local_30;
    bVar1 = MoleculeStamp::getConstrainTotalCharge((MoleculeStamp *)0x1e2785);
    Molecule::setConstrainTotalCharge(pMVar2,bVar1);
  }
  Molecule::complete(in_stack_00000100);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
             in_stack_fffffffffffffd20._M_current);
  return local_30;
}

Assistant:

Molecule* MoleculeCreator::createMolecule(ForceField* ff,
                                            MoleculeStamp* molStamp,
                                            int globalIndex,
                                            LocalIndexManager* localIndexMan) {
    Molecule* mol = new Molecule(globalIndex, molStamp);

    // create atoms
    Atom* atom;
    AtomStamp* currentAtomStamp;
    size_t nAtom = molStamp->getNAtoms();
    for (size_t i = 0; i < nAtom; ++i) {
      currentAtomStamp = molStamp->getAtomStamp(i);
      atom             = createAtom(ff, currentAtomStamp, localIndexMan);
      mol->addAtom(atom);
    }

    // create rigidbodies
    RigidBody* rb;
    RigidBodyStamp* currentRigidBodyStamp;
    size_t nRigidbodies = molStamp->getNRigidBodies();

    for (size_t i = 0; i < nRigidbodies; ++i) {
      currentRigidBodyStamp = molStamp->getRigidBodyStamp(i);
      rb = createRigidBody(molStamp, mol, currentRigidBodyStamp, localIndexMan);
      mol->addRigidBody(rb);
    }

    // create bonds
    Bond* bond;
    BondStamp* currentBondStamp;
    size_t nBonds = molStamp->getNBonds();

    for (size_t i = 0; i < nBonds; ++i) {
      currentBondStamp = molStamp->getBondStamp(i);
      bond             = createBond(ff, mol, currentBondStamp, localIndexMan);
      mol->addBond(bond);
    }

    // create bends
    Bend* bend;
    BendStamp* currentBendStamp;
    size_t nBends = molStamp->getNBends();
    for (size_t i = 0; i < nBends; ++i) {
      currentBendStamp = molStamp->getBendStamp(i);
      bend             = createBend(ff, mol, currentBendStamp, localIndexMan);
      mol->addBend(bend);
    }

    // create torsions
    Torsion* torsion;
    TorsionStamp* currentTorsionStamp;
    size_t nTorsions = molStamp->getNTorsions();
    for (size_t i = 0; i < nTorsions; ++i) {
      currentTorsionStamp = molStamp->getTorsionStamp(i);
      torsion = createTorsion(ff, mol, currentTorsionStamp, localIndexMan);
      mol->addTorsion(torsion);
    }

    // create inversions
    Inversion* inversion;
    InversionStamp* currentInversionStamp;
    size_t nInversions = molStamp->getNInversions();
    for (size_t i = 0; i < nInversions; ++i) {
      currentInversionStamp = molStamp->getInversionStamp(i);
      inversion =
          createInversion(ff, mol, currentInversionStamp, localIndexMan);
      if (inversion != NULL) { mol->addInversion(inversion); }
    }

    // create cutoffGroups
    CutoffGroup* cutoffGroup;
    CutoffGroupStamp* currentCutoffGroupStamp;
    size_t nCutoffGroups = molStamp->getNCutoffGroups();
    for (size_t i = 0; i < nCutoffGroups; ++i) {
      currentCutoffGroupStamp = molStamp->getCutoffGroupStamp(i);
      cutoffGroup =
          createCutoffGroup(mol, currentCutoffGroupStamp, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // every free atom is a cutoff group
    std::vector<Atom*> freeAtoms;
    std::vector<Atom*>::iterator ai;
    std::vector<Atom*>::iterator fai;

    // add all atoms into allAtoms set
    for (atom = mol->beginAtom(fai); atom != NULL; atom = mol->nextAtom(fai)) {
      freeAtoms.push_back(atom);
    }

    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    for (cg = mol->beginCutoffGroup(ci); cg != NULL;
         cg = mol->nextCutoffGroup(ci)) {
      for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
        // erase the atoms belong to cutoff groups from freeAtoms vector
        freeAtoms.erase(std::remove(freeAtoms.begin(), freeAtoms.end(), atom),
                        freeAtoms.end());
      }
    }

    // loop over the free atoms and then create one cutoff group for
    // every single free atom

    for (fai = freeAtoms.begin(); fai != freeAtoms.end(); ++fai) {
      cutoffGroup = createCutoffGroup(mol, *fai, localIndexMan);
      mol->addCutoffGroup(cutoffGroup);
    }

    // create bonded constraintPairs:
    createConstraintPair(mol);

    // create non-bonded constraintPairs
    for (std::size_t i = 0; i < molStamp->getNConstraints(); ++i) {
      ConstraintStamp* cStamp = molStamp->getConstraintStamp(i);
      Atom* atomA;
      Atom* atomB;

      atomA = mol->getAtomAt(cStamp->getA());
      atomB = mol->getAtomAt(cStamp->getB());
      assert(atomA && atomB);

      bool printConstraintForce = false;

      if (cStamp->havePrintConstraintForce()) {
        printConstraintForce = cStamp->getPrintConstraintForce();
      }

      if (!cStamp->haveConstrainedDistance()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Constraint Error: A non-bond constraint was specified\n"
                 "\twithout providing a value for the constrainedDistance.\n");
        painCave.isFatal = 1;
        simError();
      } else {
        RealType distance         = cStamp->getConstrainedDistance();
        ConstraintElem* consElemA = new ConstraintElem(atomA);
        ConstraintElem* consElemB = new ConstraintElem(atomB);
        ConstraintPair* cPair     = new ConstraintPair(
            consElemA, consElemB, distance, printConstraintForce);
        mol->addConstraintPair(cPair);
      }
    }

    // now create the constraint elements:

    createConstraintElem(mol);

    // Does this molecule stamp define a total constrained charge value?
    // If so, let the created molecule know about it.
    if (molStamp->haveConstrainTotalCharge()) {
      mol->setConstrainTotalCharge(molStamp->getConstrainTotalCharge());
    }

    // The construction of this molecule is finished:
    mol->complete();

    return mol;
  }